

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void cmCacheManager::OutputWarningComment(ostream *fout,string *message,bool wrapSpaces)

{
  char cVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type i;
  ulong uVar4;
  ulong uVar5;
  string oneLine;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  uVar2 = message->_M_string_length;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  uVar4 = 0;
  uVar5 = 0;
  do {
    if (((uVar2 == uVar4) || (cVar1 = (message->_M_dataplus)._M_p[uVar4], cVar1 == '\n')) ||
       ((0x3b < uVar4 - uVar5 && wrapSpaces) && cVar1 == ' ')) {
      std::__ostream_insert<char,std::char_traits<char>>(fout,"# ",2);
      if ((message->_M_dataplus)._M_p[uVar5] == '\n') {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"\\n",2);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)message);
      std::__cxx11::string::operator=((string *)&local_70,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_70,local_68);
      local_50 = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
      uVar5 = uVar4;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 <= uVar2);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void cmCacheManager::OutputWarningComment(std::ostream& fout,
                                          std::string const& message,
                                          bool wrapSpaces)
{
  std::string::size_type end = message.size();
  std::string oneLine;
  std::string::size_type pos = 0;
  for (std::string::size_type i = 0; i <= end; i++) {
    if ((i == end) || (message[i] == '\n') ||
        ((i - pos >= 60) && (message[i] == ' ') && wrapSpaces)) {
      fout << "# ";
      if (message[pos] == '\n') {
        pos++;
        fout << "\\n";
      }
      oneLine = message.substr(pos, i - pos);
      fout << oneLine << '\n';
      pos = i;
    }
  }
}